

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

uint utf8_text_width(string *str)

{
  wchar_t ucs;
  int iVar1;
  size_type sStack_20;
  uint c;
  size_type i;
  uint length;
  bool in_color;
  string *str_local;
  
  i._7_1_ = 0;
  i._0_4_ = 0;
  sStack_20 = 0;
  _length = str;
  while (ucs = utf8_next_char(_length,&stack0xffffffffffffffe0), ucs != L'\0') {
    if ((i._7_1_ & 1) == 0) {
      if (ucs == L'\x1b') {
        i._7_1_ = 1;
      }
      else {
        iVar1 = mk_wcwidth(ucs);
        i._0_4_ = iVar1 + (uint)i;
      }
    }
    else if (ucs == L'm') {
      i._7_1_ = 0;
    }
  }
  return (uint)i;
}

Assistant:

unsigned int utf8_text_width (const std::string& str)
{
  bool in_color = false;

  unsigned int length = 0;
  std::string::size_type i = 0;
  unsigned int c;
  while ((c = utf8_next_char (str, i)))
  {
    if (in_color)
    {
      if (c == 'm')
        in_color = false;
    }
    else if (c == 033)
    {
      in_color = true;
    }
    else
      length += mk_wcwidth (c);
  }

  return length;
}